

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL_mock::GLFrameBuffer::addDepthBuffer
          (GLFrameBuffer *this,shared_ptr<polyscope::render::RenderBuffer> *renderBufferIn)

{
  bool bVar1;
  runtime_error *this_00;
  element_type *this_01;
  socklen_t in_ECX;
  sockaddr *__addr;
  int in_ESI;
  shared_ptr<polyscope::render::RenderBuffer> *in_RDI;
  shared_ptr<polyscope::render::backend_openGL_mock::GLRenderBuffer> renderBuffer;
  value_type *in_stack_ffffffffffffff98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_02;
  __shared_ptr local_20 [32];
  
  std::
  dynamic_pointer_cast<polyscope::render::backend_openGL_mock::GLRenderBuffer,polyscope::render::RenderBuffer>
            (in_RDI);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"tried to bind to non-GL render buffer");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = std::
            __shared_ptr_access<polyscope::render::backend_openGL_mock::GLRenderBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<polyscope::render::backend_openGL_mock::GLRenderBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3fc64a);
  GLRenderBuffer::bind(this_01,in_ESI,__addr,in_ECX);
  (**(code **)&((in_RDI->
                super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->sizeY)();
  checkGLError(true);
  this_02 = &in_RDI[5].
             super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  std::shared_ptr<polyscope::render::RenderBuffer>::
  shared_ptr<polyscope::render::backend_openGL_mock::GLRenderBuffer,void>
            ((shared_ptr<polyscope::render::RenderBuffer> *)this_02,
             (shared_ptr<polyscope::render::backend_openGL_mock::GLRenderBuffer> *)
             in_stack_ffffffffffffff98);
  std::
  vector<std::shared_ptr<polyscope::render::RenderBuffer>,_std::allocator<std::shared_ptr<polyscope::render::RenderBuffer>_>_>
  ::push_back((vector<std::shared_ptr<polyscope::render::RenderBuffer>,_std::allocator<std::shared_ptr<polyscope::render::RenderBuffer>_>_>
               *)this_02,in_stack_ffffffffffffff98);
  std::shared_ptr<polyscope::render::RenderBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::RenderBuffer> *)0x3fc6a9);
  std::shared_ptr<polyscope::render::backend_openGL_mock::GLRenderBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::backend_openGL_mock::GLRenderBuffer> *)0x3fc6b3);
  return;
}

Assistant:

void GLFrameBuffer::addDepthBuffer(std::shared_ptr<RenderBuffer> renderBufferIn) {
  // it _better_ be a GL buffer
  std::shared_ptr<GLRenderBuffer> renderBuffer = std::dynamic_pointer_cast<GLRenderBuffer>(renderBufferIn);
  if (!renderBuffer) throw std::runtime_error("tried to bind to non-GL render buffer");

  renderBuffer->bind();
  bind();

  // Sanity checks
  // if (depthRenderBuffer != nullptr) throw std::runtime_error("OpenGL error: already bound to render buffer");
  // if (depthTextureBuffer != nullptr) throw std::runtime_error("OpenGL error: already bound to texture buffer");

  checkGLError();
  renderBuffersDepth.push_back(renderBuffer);
}